

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

void __thiscall ON_RevSurface::DestroyRuntimeCache(ON_RevSurface *this,bool bDelete)

{
  undefined8 extraout_RDX;
  bool bDelete_local;
  ON_RevSurface *this_local;
  
  ON_Surface::DestroyRuntimeCache(&this->super_ON_Surface,bDelete);
  if (this->m_curve != (ON_Curve *)0x0) {
    (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x17])
              (this->m_curve,(ulong)bDelete & 1,extraout_RDX,
               CONCAT71((int7)((ulong)this >> 8),bDelete) & 0xffffffffffffff01);
  }
  ON_BoundingBox::Destroy(&this->m_bbox);
  return;
}

Assistant:

void ON_RevSurface::DestroyRuntimeCache( bool bDelete )
{
  ON_Surface::DestroyRuntimeCache(bDelete);
  if ( 0 != m_curve )
    m_curve->DestroyRuntimeCache(bDelete);
  // 15 August 2003 Dale Lear
  //    Added the call to destroy m_bbox.
  m_bbox.Destroy();
}